

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O2

void la_dgemv_tos(int m,int n,double *a,int lda,double *x,int incx,double *y,int incy)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  ulong uVar6;
  bool bVar7;
  double yi;
  double dVar8;
  
  if (a == (double *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xba,
                  "void la_dgemv_tos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (x == (double *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xbb,
                  "void la_dgemv_tos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (y == (double *)0x0) {
    __assert_fail("y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xbc,
                  "void la_dgemv_tos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (x == y) {
    __assert_fail("x != y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xbd,
                  "void la_dgemv_tos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if ((lda < 1) || (lda < n)) {
    __assert_fail("lda >= 1 && lda >= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xbe,
                  "void la_dgemv_tos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (incx < 1) {
    __assert_fail("incx > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xbf,
                  "void la_dgemv_tos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (incy < 1) {
    __assert_fail("incy > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xc0,
                  "void la_dgemv_tos(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  uVar4 = 0;
  uVar3 = (ulong)(uint)m;
  if (m < 1) {
    uVar3 = uVar4;
  }
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar4;
  }
  for (; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    dVar8 = 0.0;
    pdVar1 = x;
    pdVar5 = a;
    uVar6 = uVar3;
    while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
      dVar8 = dVar8 + *pdVar5 * *pdVar1;
      pdVar5 = pdVar5 + (uint)lda;
      pdVar1 = pdVar1 + (uint)incx;
    }
    y[uVar4 * (uint)incy] = dVar8;
    a = a + 1;
  }
  return;
}

Assistant:

void la_dgemv_tos(
        int m, int n,
        const double *a, int lda,
        const double *x, int incx,
        double *y, int incy)
{
    assert(a);
    assert(x);
    assert(y);
    assert(x != y);
    assert(lda >= 1 && lda >= n);
    assert(incx > 0);
    assert(incy > 0);

    for (int i = 0; i < n; i++) {
        double yi = 0.0;
        for (int j = 0; j < m; j++) {
            yi += a[j * lda + i] * x[j * incx];
        }
        y[i * incy] = yi;
    }
}